

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

size_t __thiscall capnp::_::ReaderArena::sizeInWords(ReaderArena *this)

{
  SegmentWordCount i_00;
  unsigned_long uVar1;
  SegmentId local_3c;
  SegmentReader *local_38;
  SegmentReader *segment;
  undefined1 auStack_28 [4];
  uint i;
  size_t local_18;
  size_t total;
  ReaderArena *this_local;
  
  total = (size_t)this;
  _auStack_28 = SegmentReader::getArray(&this->segment0);
  local_18 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_28);
  segment._4_4_ = 1;
  while( true ) {
    kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_3c,segment._4_4_);
    local_38 = tryGetSegment(this,local_3c);
    if (local_38 == (SegmentReader *)0x0) break;
    i_00 = SegmentReader::getSize(local_38);
    uVar1 = unboundAs<unsigned_long,unsigned_int>(i_00);
    local_18 = uVar1 + local_18;
    segment._4_4_ = segment._4_4_ + 1;
  }
  return local_18;
}

Assistant:

size_t ReaderArena::sizeInWords() {
  size_t total = segment0.getArray().size();

  for (uint i = 1; ; i++) {
    SegmentReader* segment = tryGetSegment(SegmentId(i));
    if (segment == nullptr) return total;
    total += unboundAs<size_t>(segment->getSize() / WORDS);
  }
}